

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixml.c
# Opt level: O0

char * ixmlPrintNode(IXML_Node_conflict *node)

{
  ixml_membuf *buf;
  ixml_membuf memBuf;
  IXML_Node_conflict *node_local;
  
  if (node == (IXML_Node_conflict *)0x0) {
    node_local = (IXML_Node_conflict *)0x0;
  }
  else {
    memBuf.size_inc = (size_t)node;
    ixml_membuf_init((ixml_membuf *)&buf);
    ixmlPrintDomTree((IXML_Node_conflict *)memBuf.size_inc,(ixml_membuf *)&buf);
    node_local = (IXML_Node_conflict *)buf;
  }
  return (char *)node_local;
}

Assistant:

DOMString ixmlPrintNode(IXML_Node *node)
{
	ixml_membuf memBuf;
	ixml_membuf *buf = &memBuf;

	if (node == NULL) {
		return NULL;
	}

	ixml_membuf_init(buf);
	ixmlPrintDomTree(node, buf);

	return buf->buf;
}